

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::
RenderbufferAttachmentErrorsTest(RenderbufferAttachmentErrorsTest *this,Context *context)

{
  Context *context_local;
  RenderbufferAttachmentErrorsTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"framebuffers_renderbuffer_attachment_errors",
             "Renderbuffer Attachment Errors Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RenderbufferAttachmentErrorsTest_0324e610;
  this->m_fbo_valid = 0;
  this->m_rbo_valid = 0;
  this->m_fbo_invalid = 0;
  this->m_rbo_invalid = 0;
  this->m_color_attachment_invalid = 0;
  this->m_attachment_invalid = 0;
  this->m_renderbuffer_target_invalid = 0;
  return;
}

Assistant:

RenderbufferAttachmentErrorsTest::RenderbufferAttachmentErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "framebuffers_renderbuffer_attachment_errors", "Renderbuffer Attachment Errors Test")
	, m_fbo_valid(0)
	, m_rbo_valid(0)
	, m_fbo_invalid(0)
	, m_rbo_invalid(0)
	, m_color_attachment_invalid(0)
	, m_attachment_invalid(0)
	, m_renderbuffer_target_invalid(0)
{
	/* Intentionally left blank. */
}